

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

void common_sampler_accept(common_sampler *gsmpl,llama_token token,bool accept_grammar)

{
  undefined3 in_register_00000011;
  int local_14;
  
  if (CONCAT31(in_register_00000011,accept_grammar) != 0) {
    llama_sampler_accept(gsmpl->grmr,token);
  }
  llama_sampler_accept(gsmpl->chain,token);
  ring_buffer<int>::push_back(&gsmpl->prev,&local_14);
  return;
}

Assistant:

void common_sampler_accept(struct common_sampler * gsmpl, llama_token token, bool accept_grammar) {
    if (accept_grammar) {
        llama_sampler_accept(gsmpl->grmr, token);
    }

    llama_sampler_accept(gsmpl->chain, token);

    gsmpl->prev.push_back(token);
}